

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

int32_t __thiscall
charls::jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
::decode_run_pixels(jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
                    *this,pixel_type ra,pixel_type *start_pos,int32_t pixel_count)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar11;
  
  iVar8 = 0;
  do {
    bVar2 = decoder_strategy::read_bit(&this->super_decoder_strategy);
    if (!bVar2) {
      if (pixel_count != iVar8) {
        if (*(int32_t *)(J + (long)this->run_index_ * 4) < 1) {
          iVar3 = 0;
        }
        else {
          iVar3 = decoder_strategy::read_value
                            (&this->super_decoder_strategy,
                             *(int32_t *)(J + (long)this->run_index_ * 4));
        }
        bVar2 = pixel_count < iVar3 + iVar8;
        pixel_count = iVar3 + iVar8;
        if (bVar2) {
          jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,8>,charls::decoder_strategy>
          ::decode_run_pixels();
LAB_00110703:
          __assert_fail("index <= pixel_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                        ,0x2d2,
                        "int32_t charls::jls_codec<charls::lossless_traits<charls::quad<unsigned char>, 8>, charls::decoder_strategy>::decode_run_pixels(pixel_type, pixel_type *, const int32_t) [Traits = charls::lossless_traits<charls::quad<unsigned char>, 8>, Strategy = charls::decoder_strategy]"
                       );
        }
      }
      break;
    }
    iVar3 = this->run_index_;
    iVar6 = 1 << (J[(long)iVar3 * 4] & 0x1f);
    iVar4 = pixel_count - iVar8;
    iVar7 = iVar6;
    if (iVar4 < iVar6) {
      iVar7 = iVar4;
    }
    iVar8 = iVar8 + iVar7;
    if (pixel_count < iVar8) goto LAB_00110703;
    if (iVar6 <= iVar4) {
      if (0x1d < iVar3) {
        iVar3 = 0x1e;
      }
      this->run_index_ = iVar3 + 1;
    }
  } while (iVar8 != pixel_count);
  auVar1 = _DAT_00128450;
  if (0 < pixel_count) {
    lVar5 = (ulong)(uint)pixel_count - 1;
    auVar9._8_4_ = (int)lVar5;
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar9 = auVar9 ^ _DAT_00128450;
    auVar10 = _DAT_00128430;
    auVar12 = _DAT_00128440;
    do {
      auVar13 = auVar12 ^ auVar1;
      iVar8 = auVar9._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar8 && auVar9._0_4_ < auVar13._0_4_ || iVar8 < auVar13._4_4_)
                & 1)) {
        *(pixel_type *)(&(start_pos->super_triplet<unsigned_char>).field_0 + lVar5) = ra;
      }
      if ((auVar13._12_4_ != auVar9._12_4_ || auVar13._8_4_ <= auVar9._8_4_) &&
          auVar13._12_4_ <= auVar9._12_4_) {
        *(pixel_type *)(&start_pos[1].super_triplet<unsigned_char>.field_0 + lVar5) = ra;
      }
      auVar13 = auVar10 ^ auVar1;
      iVar3 = auVar13._4_4_;
      if (iVar3 <= iVar8 && (iVar3 != iVar8 || auVar13._0_4_ <= auVar9._0_4_)) {
        *(pixel_type *)(&start_pos[2].super_triplet<unsigned_char>.field_0 + lVar5) = ra;
        *(pixel_type *)(&start_pos[3].super_triplet<unsigned_char>.field_0 + lVar5) = ra;
      }
      lVar11 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar11 + 4;
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar11 + 4;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(pixel_count + 3U >> 2) << 4 != lVar5);
  }
  return pixel_count;
}

Assistant:

int32_t decode_run_pixels(pixel_type ra, pixel_type* start_pos, const int32_t pixel_count)
    {
        int32_t index{};
        while (Strategy::read_bit())
        {
            const int count{std::min(1 << J[run_index_], pixel_count - index)};
            index += count;
            ASSERT(index <= pixel_count);

            if (count == (1 << J[run_index_]))
            {
                increment_run_index();
            }

            if (index == pixel_count)
                break;
        }

        if (index != pixel_count)
        {
            // incomplete run.
            index += (J[run_index_] > 0) ? Strategy::read_value(J[run_index_]) : 0;
        }

        if (UNLIKELY(index > pixel_count))
            impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);

        for (int32_t i{}; i < index; ++i)
        {
            start_pos[i] = ra;
        }

        return index;
    }